

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

UBool icu_63::compat_SyncMutableUTextContents(UText *ut)

{
  UnicodeString *this;
  int32_t iVar1;
  int64_t iVar2;
  char16_t *pcVar3;
  bool bVar4;
  int32_t newLength;
  UnicodeString *us;
  UBool retVal;
  UText *ut_local;
  
  iVar2 = utext_nativeLength_63(ut);
  bVar4 = iVar2 != ut->nativeIndexingLimit;
  if (bVar4) {
    this = (UnicodeString *)ut->context;
    iVar1 = UnicodeString::length(this);
    pcVar3 = UnicodeString::getBuffer(this);
    ut->chunkContents = pcVar3;
    ut->chunkLength = iVar1;
    ut->chunkNativeLimit = (long)iVar1;
    ut->nativeIndexingLimit = iVar1;
  }
  return bVar4;
}

Assistant:

static UBool compat_SyncMutableUTextContents(UText *ut) {
    UBool retVal = FALSE;

    //  In the following test, we're really only interested in whether the UText should switch
    //  between heap and stack allocation.  If length hasn't changed, we won't, so the chunkContents
    //  will still point to the correct data.
    if (utext_nativeLength(ut) != ut->nativeIndexingLimit) {
        UnicodeString *us=(UnicodeString *)ut->context;

        // Update to the latest length.
        // For example, (utext_nativeLength(ut) != ut->nativeIndexingLimit).
        int32_t newLength = us->length();

        // Update the chunk description.
        // The buffer may have switched between stack- and heap-based.
        ut->chunkContents    = us->getBuffer();
        ut->chunkLength      = newLength;
        ut->chunkNativeLimit = newLength;
        ut->nativeIndexingLimit = newLength;
        retVal = TRUE;
    }

    return retVal;
}